

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O1

unique_ptr<wasm_functype_t,_std::default_delete<wasm_functype_t>_> __thiscall
wabt::MakeUnique<wasm_functype_t,wabt::interp::FuncType&>(wabt *this,FuncType *args)

{
  wasm_functype_t *this_00;
  FuncType local_60;
  
  this_00 = (wasm_functype_t *)operator_new(0x30);
  local_60.super_ExternType.kind = (args->super_ExternType).kind;
  local_60.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_001ea8b0;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_60.params,&args->params);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_60.results,&args->results);
  wasm_functype_t::wasm_functype_t(this_00,&local_60);
  *(wasm_functype_t **)this = this_00;
  local_60.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_001ea8b0;
  if (local_60.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_60.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return (__uniq_ptr_data<wasm_functype_t,_std::default_delete<wasm_functype_t>,_true,_true>)
         (__uniq_ptr_data<wasm_functype_t,_std::default_delete<wasm_functype_t>,_true,_true>)this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}